

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,TextGenerator *generator)

{
  undefined8 *puVar1;
  protobuf *this_00;
  bool bVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  uint *dest;
  TextGenerator *extraout_RDX;
  unsigned_long i;
  TextGenerator *extraout_RDX_00;
  TextGenerator *extraout_RDX_01;
  TextGenerator *extraout_RDX_02;
  TextGenerator *extraout_RDX_03;
  TextGenerator *extraout_RDX_04;
  TextGenerator *pTVar4;
  TextGenerator *extraout_RDX_05;
  pointer pUVar5;
  char *pcVar6;
  UnknownFieldSet UVar7;
  size_t size;
  long lVar8;
  long lVar9;
  Hex hex;
  Hex hex_00;
  StringPiece src;
  UnknownFieldSet embedded_unknown_fields;
  string printed;
  string field_number;
  UnknownFieldSet local_b0;
  size_t local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [48];
  string local_60;
  string *local_40;
  UnknownFieldSet *local_38;
  
  pvVar3 = unknown_fields->fields_;
  if (pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
    local_40 = &generator->indent_;
    lVar8 = -1;
    lVar9 = 8;
    pTVar4 = generator;
    local_38 = unknown_fields;
    do {
      pUVar5 = (pvVar3->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 1;
      if ((int)((ulong)((long)(pvVar3->
                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5) >> 4) <=
          lVar8) {
        return;
      }
      SimpleItoa_abi_cxx11_
                (&local_60,(protobuf *)(ulong)*(uint *)((long)pUVar5 + lVar9 + -8),(int)pTVar4);
      dest = &switchD_0032fe04::switchdataD_003afedc;
      pTVar4 = extraout_RDX;
      switch(*(undefined4 *)((long)pUVar5 + lVar9 + -4)) {
      case 0:
        TextGenerator::Print(generator,local_60._M_dataplus._M_p,local_60._M_string_length);
        TextGenerator::Print(generator,": ",2);
        if (*(int *)((long)pUVar5 + lVar9 + -4) != 0) {
          __assert_fail("type() == TYPE_VARINT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x131,"uint64 google::protobuf::UnknownField::varint() const");
        }
        SimpleItoa_abi_cxx11_((string *)local_90,*(protobuf **)((long)&pUVar5->number_ + lVar9),i);
        TextGenerator::Print(generator,(char *)local_90._0_8_,local_90._8_8_);
        pUVar5 = (pointer)local_90._16_8_;
        UVar7.fields_ =
             (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              *)local_90._0_8_;
        if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) goto LAB_00330021;
        goto LAB_00330029;
      case 1:
        TextGenerator::Print(generator,local_60._M_dataplus._M_p,local_60._M_string_length);
        TextGenerator::Print(generator,": 0x",4);
        if (*(int *)((long)pUVar5 + lVar9 + -4) != 1) {
          __assert_fail("type() == TYPE_FIXED32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x135,"uint32 google::protobuf::UnknownField::fixed32() const");
        }
        hex_00.value = (ulong)*(uint *)((long)&pUVar5->number_ + lVar9);
        hex_00._8_8_ = 8;
        strings::AlphaNum::AlphaNum((AlphaNum *)local_90,hex_00);
        local_b0.fields_ =
             (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              *)local_a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,local_90._0_8_,(char *)(local_90._0_8_ + local_90._8_8_));
        TextGenerator::Print(generator,(char *)local_b0.fields_,local_a8);
        goto LAB_00330012;
      case 2:
        TextGenerator::Print(generator,local_60._M_dataplus._M_p,local_60._M_string_length);
        TextGenerator::Print(generator,": 0x",4);
        if (*(int *)((long)pUVar5 + lVar9 + -4) != 2) {
          __assert_fail("type() == TYPE_FIXED64",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x139,"uint64 google::protobuf::UnknownField::fixed64() const");
        }
        hex._8_8_ = 0x10;
        hex.value = *(uint64 *)((long)&pUVar5->number_ + lVar9);
        strings::AlphaNum::AlphaNum((AlphaNum *)local_90,hex);
        local_b0.fields_ =
             (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              *)local_a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,local_90._0_8_,(char *)(local_90._0_8_ + local_90._8_8_));
        TextGenerator::Print(generator,(char *)local_b0.fields_,local_a8);
LAB_00330012:
        pUVar5 = (pointer)local_a0._0_8_;
        UVar7.fields_ = local_b0.fields_;
        if (local_b0.fields_ !=
            (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             *)local_a0) {
LAB_00330021:
          operator_delete(UVar7.fields_,(ulong)((long)&pUVar5->number_ + 1));
        }
LAB_00330029:
        pcVar6 = "\n";
        if (this->single_line_mode_ != false) {
          pcVar6 = " ";
        }
        size = 1;
LAB_00330046:
        TextGenerator::Print(generator,pcVar6,size);
        pTVar4 = extraout_RDX_00;
        break;
      case 3:
        TextGenerator::Print(generator,local_60._M_dataplus._M_p,local_60._M_string_length);
        if (*(int *)((long)pUVar5 + lVar9 + -4) != 3) {
          __assert_fail("type() == TYPE_LENGTH_DELIMITED",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x13d,
                        "const string &google::protobuf::UnknownField::length_delimited() const");
        }
        puVar1 = *(undefined8 **)((long)&pUVar5->number_ + lVar9);
        local_b0.fields_ =
             (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              *)0x0;
        if ((puVar1[1] == 0) ||
           (bVar2 = UnknownFieldSet::ParseFromArray(&local_b0,(void *)*puVar1,(int)puVar1[1]),
           !bVar2)) {
          local_90._0_8_ = local_90 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_90,": \"","");
          this_00 = (protobuf *)*puVar1;
          pcVar6 = (char *)puVar1[1];
          if ((long)pcVar6 < 0) {
            StringPiece::LogFatalSizeTooBig((size_t)pcVar6,"size_t to int conversion");
          }
          src.length_ = (stringpiece_ssize_type)local_90;
          src.ptr_ = pcVar6;
          CEscapeAndAppend(this_00,src,(string *)dest);
          std::__cxx11::string::append(local_90);
          TextGenerator::Print(generator,(char *)local_90._0_8_,local_90._8_8_);
          pTVar4 = extraout_RDX_02;
          if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
            operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
            pTVar4 = extraout_RDX_03;
          }
        }
        else {
          if (this->single_line_mode_ == true) {
            TextGenerator::Print(generator," { ",3);
          }
          else {
            TextGenerator::Print(generator," {\n",3);
            std::__cxx11::string::append((char *)local_40);
          }
          PrintUnknownFields(this,&local_b0,generator);
          pcVar6 = "} ";
          if (this->single_line_mode_ == false) {
            TextGenerator::Outdent(generator);
            pcVar6 = "}\n";
          }
          TextGenerator::Print(generator,pcVar6,2);
          pTVar4 = extraout_RDX_04;
        }
        if (local_b0.fields_ !=
            (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             *)0x0) {
          UnknownFieldSet::ClearFallback(&local_b0);
          pTVar4 = extraout_RDX_05;
        }
        break;
      case 4:
        TextGenerator::Print(generator,local_60._M_dataplus._M_p,local_60._M_string_length);
        if (this->single_line_mode_ == true) {
          TextGenerator::Print(generator," { ",3);
        }
        else {
          TextGenerator::Print(generator," {\n",3);
          std::__cxx11::string::append((char *)local_40);
        }
        if (*(int *)((long)pUVar5 + lVar9 + -4) != 4) {
          __assert_fail("type() == TYPE_GROUP",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x141,
                        "const UnknownFieldSet &google::protobuf::UnknownField::group() const");
        }
        PrintUnknownFields(this,*(UnknownFieldSet **)((long)&pUVar5->number_ + lVar9),generator);
        size = 2;
        if (this->single_line_mode_ == false) {
          TextGenerator::Outdent(generator);
          pcVar6 = "}\n";
        }
        else {
          pcVar6 = "} ";
        }
        goto LAB_00330046;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        pTVar4 = extraout_RDX_01;
      }
      lVar9 = lVar9 + 0x10;
      pvVar3 = local_38->fields_;
    } while (pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                        *)0x0);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, TextGenerator& generator) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    string field_number = SimpleItoa(field.number());

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        generator.Print(field_number);
        generator.Print(": ");
        generator.Print(SimpleItoa(field.varint()));
        if (single_line_mode_) {
          generator.Print(" ");
        } else {
          generator.Print("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        generator.Print(field_number);
        generator.Print(": 0x");
        generator.Print(
            StrCat(strings::Hex(field.fixed32(), strings::ZERO_PAD_8)));
        if (single_line_mode_) {
          generator.Print(" ");
        } else {
          generator.Print("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        generator.Print(field_number);
        generator.Print(": 0x");
        generator.Print(
            StrCat(strings::Hex(field.fixed64(), strings::ZERO_PAD_16)));
        if (single_line_mode_) {
          generator.Print(" ");
        } else {
          generator.Print("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        generator.Print(field_number);
        const string& value = field.length_delimited();
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && embedded_unknown_fields.ParseFromString(value)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (single_line_mode_) {
            generator.Print(" { ");
          } else {
            generator.Print(" {\n");
            generator.Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator);
          if (single_line_mode_) {
            generator.Print("} ");
          } else {
            generator.Outdent();
            generator.Print("}\n");
          }
        } else {
          // This field is not parseable as a Message.
          // So it is probably just a plain string.
          string printed(": \"");
          CEscapeAndAppend(value, &printed);
          printed.append(single_line_mode_ ? "\" " : "\"\n");
          generator.Print(printed);
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        generator.Print(field_number);
        if (single_line_mode_) {
          generator.Print(" { ");
        } else {
          generator.Print(" {\n");
          generator.Indent();
        }
        PrintUnknownFields(field.group(), generator);
        if (single_line_mode_) {
          generator.Print("} ");
        } else {
          generator.Outdent();
          generator.Print("}\n");
        }
        break;
    }
  }
}